

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

int ON_SolveQuadraticEquation(double a,double b,double c,double *r0,double *r1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double y;
  double y1;
  double y0;
  double x1;
  double x0;
  double q;
  double *r1_local;
  double *r0_local;
  double c_local;
  double b_local;
  double a_local;
  
  if ((a != 0.0) || (NAN(a))) {
    if ((c != 0.0) || (NAN(c))) {
      if ((b != 0.0) || (NAN(b))) {
        x0 = b * b + -(a * 4.0 * c);
        if (ABS(x0) <= b * b * 2.220446049250313e-16) {
          x0 = 0.0;
        }
        if (0.0 < x0) {
          dVar2 = sqrt(x0);
          x0 = (ABS(b) + dVar2) * 0.5;
          if (0.0 < b) {
            x0 = -x0;
          }
          x1 = x0 / a;
          dVar2 = c / x0;
          if ((x1 != dVar2) || (NAN(x1) || NAN(dVar2))) {
            y0 = dVar2;
            if (dVar2 < x1) {
              y0 = x1;
              x1 = dVar2;
            }
            dVar2 = (b * -0.5) / a;
            if ((x1 <= dVar2) && (dVar2 <= y0)) {
              dVar2 = (a * dVar2 + b) * dVar2 + c;
              if ((((ABS(dVar2) <= ABS((a * x1 + b) * x1 + c)) ||
                   (ABS(dVar2) <= ABS((a * y0 + b) * y0 + c))) || ((0.0 < a && (0.0 < dVar2)))) ||
                 ((a < 0.0 && (dVar2 < 0.0)))) {
                dVar2 = (b * -0.5) / a;
                *r1 = dVar2;
                *r0 = dVar2;
                return 1;
              }
            }
            *r0 = x1;
            *r1 = y0;
            a_local._4_4_ = 0;
          }
          else {
            *r1 = x1;
            *r0 = x1;
            a_local._4_4_ = 1;
          }
        }
        else {
          *r0 = (b * -0.5) / a;
          if ((x0 != 0.0) || (NAN(x0))) {
            dVar2 = sqrt(ABS(x0));
            *r1 = ABS((dVar2 * 0.5) / a);
            dVar2 = *r0;
            dVar1 = *r1;
            dVar3 = (a * dVar2 + b) * dVar2 + c;
            if (((0.0 < a) && (dVar3 <= 0.0)) || ((a < 0.0 && (0.0 <= dVar3)))) {
              *r1 = *r0;
              a_local._4_4_ = 1;
            }
            else if ((ABS(dVar3) <= ABS(-(a * dVar1) * dVar1 + dVar3)) ||
                    (ABS(dVar3) <= ABS((a * 2.0 * dVar2 + b) * dVar1))) {
              *r1 = *r0;
              a_local._4_4_ = 1;
            }
            else {
              a_local._4_4_ = 2;
            }
          }
          else {
            *r1 = *r0;
            a_local._4_4_ = 1;
          }
        }
      }
      else {
        dVar2 = sqrt(ABS(c / -a));
        *r1 = dVar2;
        if (0.0 <= c / -a) {
          *r0 = -*r1;
          a_local._4_4_ = 0;
        }
        else {
          *r0 = 0.0;
          a_local._4_4_ = 2;
        }
      }
    }
    else if ((b != 0.0) || (NAN(b))) {
      dVar2 = b / -a;
      if (0.0 <= dVar2) {
        *r0 = 0.0;
        *r1 = dVar2;
      }
      else {
        *r0 = dVar2;
        *r1 = 0.0;
      }
      a_local._4_4_ = 0;
    }
    else {
      *r1 = 0.0;
      *r0 = 0.0;
      a_local._4_4_ = 1;
    }
  }
  else if ((b != 0.0) || (NAN(b))) {
    *r1 = -c / b;
    *r0 = -c / b;
    a_local._4_4_ = -1;
  }
  else {
    *r1 = 0.0;
    *r0 = 0.0;
    a_local._4_4_ = -2;
    if (c == 0.0) {
      a_local._4_4_ = -3;
    }
  }
  return a_local._4_4_;
}

Assistant:

int
ON_SolveQuadraticEquation(
       double a, double b, double c, 
       double *r0, double *r1
       )
/* Find solutions of a quadratic equation
 *
 * INPUT:
 *   a, b, c  coefficients defining the quadratic equation
 *            a*t^2 + b*t + c = 0
 *   r0, r1   address of doubles
 * OUTPUT:
 *   ON_QuadraticEquation()
 *      0: successful - two distinct real roots (*r0 < *r1)
 *      1: successful - one real root (*r0 = *r1)
 *      2: successful - two complex conjugate roots (*r0 +/- (*r1)*sqrt(-1))
 *     -1: failure - a = 0, b != 0        (*r0 = *r1 = -c/b)
 *     -2: failure - a = 0, b  = 0 c != 0 (*r0 = *r1 = 0.0)
 *     -3: failure - a = 0, b  = 0 c  = 0 (*r0 = *r1 = 0.0)
 *
 * COMMENTS:
 *   The quadratic equation is solved using the formula
 *   roots = q/a, c/q, q = 0.5*(b + sgn(b)*sqrt(b^2 - 4ac)).
 *
 *   When |b^2 - 4*a*c| <= b*b*ON_EPSILON, the discriminant
 *   is numerical noise and is assumed to be zero.
 *
 *   If it is really important to have the best possible answer,
 *   you should probably tune up the returned roots using
 *   Brent's algorithm.
 *
 * REFERENCE:
 *   Numerical Recipes in C, section 5.5
 *
 * RELATED FUNCTIONS:
 *   ON_CubicEquation()
 */
{
  double q, x0, x1, y0, y1, y;

  if (a == 0.0) {
    if (b == 0.0) 
      {*r0 = *r1 = 0.0; return (c == 0.0) ? -3 : -2;}
    *r0 = *r1 = -c/b; return -1;
  }

  if (c == 0.0) {
    if (b == 0.0) 
      {*r0 = *r1 = 0.0; return 1;}
    b /= -a;
    if (b < 0.0) 
      {*r0=b;*r1=0.0;} 
    else
      {*r0=0.0;*r1=b;}
    return 0;
  }

  if (b == 0.0) {
    c /= -a;
    *r1 = sqrt(fabs(c));
    if (c < 0.0) 
      {*r0 = 0.0; return 2;}
    *r0 = -(*r1);
    return 0;
  }
  q = b*b - 4.0*a*c;
  if (fabs(q) <= b*b* ON_EPSILON) 
    q = 0.0; /* q is noise - set it to zero */
  if (q <= 0.0) {
    /* multiple real root or complex conjugate roots */
    *r0 = -0.5*b/a;
    if (q == 0.0) 
      {*r1 = *r0; return 1;}

    /* complex conjugate roots (probably) */
    *r1 = fabs(0.5*sqrt(fabs(q))/a); 
    x0 = *r0;
    x1 = *r1;
    y = (a*x0 + b)*x0 + c;            /* y = quadratic evaluated at -b/2a */
    if ((a > 0.0 && y <= 0.0) || (a < 0.0 && y >= 0.0))
      {*r1 = *r0; return 1;}
    y0 = y - a*x1*x1;                 /* y0 = real part of "zero" */
    y1 = (2.0*a*x0 + b)*x1;           /* y1 = imaginary part of "zero" */
    if (fabs(y) <= fabs(y0) || fabs(y) <= fabs(y1)) 
      {*r1 = *r0; return 1;}
    return 2;
  }

  /* distinct roots (probably) */
  q = 0.5*(fabs(b) + sqrt(q));
  if (b > 0.0) q = -q;
  x0 = q/a;
  x1 = c/q;
  if (x0 == x1) 
    {*r0 = *r1 = x0; return 1;}

  if (x0 > x1) 
    {y = x0; x0 = x1; x1 = y;}

  /* quick test to see if roots are numerically distinct from extrema */
  y = -0.5*b/a;
  if (x0 <= y && y <= x1) {
    y = (a*y + b)*y + c;              /* y = quadratic evaluated at -b/2a */
    y0 = (a*x0 + b)*x0 + c;
    y1 = (a*x1 + b)*x1 + c;
    if (fabs(y) <= fabs(y0) || fabs(y) <= fabs(y1)
        || (a > 0.0 && y > 0.0) || (a < 0.0 && y < 0.0))
      {*r0 = *r1 = -0.5*b/a; return 1;}
  }

  /* distinct roots */
  *r0 = x0;
  *r1 = x1;
  return 0;
}